

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O3

void uv__poll_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  code *UNRECOVERED_JUMPTABLE;
  uint uVar1;
  undefined8 uVar2;
  
  if ((events & 8) == 0) {
    uVar1 = events >> 1 & 2 | events & 1;
    UNRECOVERED_JUMPTABLE = *(code **)&w[-1].fd;
    uVar2 = 0;
  }
  else {
    uv__io_stop(loop,w,5);
    uVar1 = *(uint *)(w[-1].watcher_queue + 1);
    if (((uVar1 >> 0xe & 1) != 0) &&
       (*(uint *)(w[-1].watcher_queue + 1) = uVar1 & 0xffffbfff, (uVar1 >> 0xd & 1) != 0)) {
      *(int *)(w[-1].cb + 8) = *(int *)(w[-1].cb + 8) + -1;
    }
    UNRECOVERED_JUMPTABLE = *(code **)&w[-1].fd;
    uVar2 = 0xfffffff7;
    uVar1 = 0;
  }
  (*UNRECOVERED_JUMPTABLE)(&w[-2].pevents,uVar2,uVar1);
  return;
}

Assistant:

static void uv__poll_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_poll_t* handle;
  int pevents;

  handle = container_of(w, uv_poll_t, io_watcher);

  if (events & UV__POLLERR) {
    uv__io_stop(loop, w, UV__POLLIN | UV__POLLOUT);
    uv__handle_stop(handle);
    handle->poll_cb(handle, -EBADF, 0);
    return;
  }

  pevents = 0;
  if (events & UV__POLLIN)
    pevents |= UV_READABLE;
  if (events & UV__POLLOUT)
    pevents |= UV_WRITABLE;

  handle->poll_cb(handle, 0, pevents);
}